

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O0

FT_Error tt_size_select(FT_Size size,FT_ULong strike_index)

{
  FT_Face pFVar1;
  FT_Size_Metrics *size_metrics;
  SFNT_Service sfnt;
  FT_Error error;
  TT_Size ttsize;
  TT_Face ttface;
  FT_ULong strike_index_local;
  FT_Size size_local;
  
  pFVar1 = size->face;
  sfnt._4_4_ = 0;
  size[2].metrics.descender = strike_index;
  if ((size->face->face_flags & 1U) == 0) {
    sfnt._4_4_ = (**(code **)(*(long *)&pFVar1[3].units_per_EM + 0xd8))
                           (pFVar1,strike_index,&size->metrics);
    if (sfnt._4_4_ != 0) {
      size[2].metrics.descender = 0xffffffff;
    }
  }
  else {
    FT_Select_Metrics(size->face,strike_index);
    tt_size_reset((TT_Size)size,'\0');
  }
  return sfnt._4_4_;
}

Assistant:

static FT_Error
  tt_size_select( FT_Size   size,
                  FT_ULong  strike_index )
  {
    TT_Face   ttface = (TT_Face)size->face;
    TT_Size   ttsize = (TT_Size)size;
    FT_Error  error  = FT_Err_Ok;


    ttsize->strike_index = strike_index;

    if ( FT_IS_SCALABLE( size->face ) )
    {
      /* use the scaled metrics, even when tt_size_reset fails */
      FT_Select_Metrics( size->face, strike_index );

      tt_size_reset( ttsize, 0 ); /* ignore return value */
    }
    else
    {
      SFNT_Service      sfnt         = (SFNT_Service)ttface->sfnt;
      FT_Size_Metrics*  size_metrics = &size->metrics;


      error = sfnt->load_strike_metrics( ttface,
                                         strike_index,
                                         size_metrics );
      if ( error )
        ttsize->strike_index = 0xFFFFFFFFUL;
    }

    return error;
  }